

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBB.cpp
# Opt level: O3

void __thiscall
chrono::collision::CHOBB::FitToGeometries
          (CHOBB *this,ChMatrix33<double> *O,
          vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
          *mgeos,int firstgeo,int ngeos,double envelope)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChGeometry *this_00;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 local_88 [16];
  double local_78;
  undefined1 local_68 [16];
  double local_58;
  double local_48;
  
  local_88._8_8_ = 0xffefffffffffffff;
  local_88._0_8_ = 0xffefffffffffffff;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_68._8_8_ = 0x7fefffffffffffff;
  local_68._0_8_ = 0x7fefffffffffffff;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  local_78 = -1.79769313486232e+308;
  local_58 = 1.79769313486232e+308;
  local_48 = envelope;
  if (ngeos < 1) {
    auVar11 = ZEXT816(0x3ff0000000000000);
    dVar10 = 1.0;
    local_58 = 1.79769313486232e+308;
    local_78 = -1.79769313486232e+308;
    auVar13 = auVar11;
  }
  else {
    lVar8 = (long)firstgeo;
    uVar7 = (ulong)(uint)ngeos;
    do {
      this_00 = (mgeos->
                super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar8];
      if (this_00 != (ChGeometry *)0x0) {
        geometry::ChGeometry::InflateBoundingBox
                  (this_00,(ChVector<double> *)local_68,(ChVector<double> *)local_88,&this->Rot);
      }
      lVar8 = lVar8 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    dVar10 = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  }
  auVar16._0_8_ = local_68._0_8_ + local_88._0_8_;
  auVar16._8_8_ = local_68._8_8_ + local_88._8_8_;
  auVar6 = vsubpd_avx(local_88,local_68);
  auVar9._8_8_ = 0x3fe0000000000000;
  auVar9._0_8_ = 0x3fe0000000000000;
  auVar9 = vmulpd_avx512vl(auVar6,auVar9);
  auVar6 = vshufpd_avx(auVar16,auVar16,1);
  dVar4 = (local_58 + local_78) * 0.5;
  dVar5 = auVar6._0_8_ * 0.5;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar16._0_8_ * 0.5;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       dVar5 * (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  auVar6 = vfmadd231sd_fma(auVar20,auVar18,auVar6);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar5 * dVar10;
  auVar1 = vfmadd231sd_fma(auVar12,auVar18,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  auVar1 = vfmadd231sd_fma(auVar1,auVar14,auVar2);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       dVar5 * (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar16._0_8_ * 0.5;
  auVar11 = vfmadd231sd_fma(auVar17,auVar19,auVar11);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar11 = vfmadd231sd_fma(auVar11,auVar14,auVar3);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar4;
  auVar13 = vfmadd231sd_fma(auVar6,auVar15,auVar13);
  (this->To).m_data[0] = auVar11._0_8_;
  (this->To).m_data[1] = auVar1._0_8_;
  (this->To).m_data[2] = auVar13._0_8_;
  (this->d).m_data[0] = auVar9._0_8_ + local_48;
  (this->d).m_data[1] = auVar9._8_8_ + local_48;
  (this->d).m_data[2] = (local_78 - local_58) * 0.5 + local_48;
  return;
}

Assistant:

void CHOBB::FitToGeometries(ChMatrix33<>& O,
                            std::vector<geometry::ChGeometry*> mgeos,
                            int firstgeo,
                            int ngeos,
                            double envelope) {
    // store orientation

    this->Rot = ChMatrix33<>(1);

    ChVector<> cmin(+std::numeric_limits<double>::max());
    ChVector<> cmax(-std::numeric_limits<double>::max());

    geometry::ChGeometry* nit;
    for (int count = 0; count < ngeos; ++count) {
        nit = mgeos[firstgeo + count];
        if (nit) {
            nit->InflateBoundingBox(cmin, cmax, Rot);
        }
    }

    ChVector<> c = (cmin + cmax) / 2;
    To = Rot * c;

    d = (cmax - cmin) / 2 + ChVector<>(envelope);
}